

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float64 float64_squash_input_denormal_mips(float64 a,float_status *status)

{
  FloatParts FVar1;
  
  if (status->flush_inputs_to_zero != '\0') {
    FVar1 = float64_unpack_raw(a);
    if (FVar1.frac != 0 && FVar1.exp == 0) {
      status->float_exception_flags = status->float_exception_flags | 0x40;
      a = (FVar1._8_8_ & 0x10000000000) << 0x17;
    }
  }
  return a;
}

Assistant:

float64 float64_squash_input_denormal(float64 a, float_status *status)
{
    if (status->flush_inputs_to_zero) {
        FloatParts p = float64_unpack_raw(a);
        if (parts_squash_denormal(p, status)) {
            return float64_set_sign(float64_zero, p.sign);
        }
    }
    return a;
}